

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_rules.cpp
# Opt level: O3

bool duckdb::LogicalTypeIsValid(LogicalType *type)

{
  LogicalTypeId LVar1;
  bool bVar2;
  idx_t iVar3;
  LogicalType *pLVar4;
  idx_t iVar5;
  bool bVar6;
  
  do {
    LVar1 = type->id_;
    if (LVar1 < STRUCT) {
      if (LVar1 != DECIMAL) {
        if (LVar1 - 2 < 2) {
          return false;
        }
        if (LVar1 == INVALID) {
          return false;
        }
        goto switchD_0024091e_caseD_67;
      }
    }
    else if ((8 < LVar1 - 100) || ((0x187U >> (LVar1 - 100 & 0x1f) & 1) == 0))
    goto switchD_0024091e_caseD_67;
    if ((type->type_info_).internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      return false;
    }
    switch(LVar1) {
    case STRUCT:
      iVar3 = StructType::GetChildCount(type);
      if (iVar3 == 0) {
switchD_0024091e_caseD_67:
        bVar2 = true;
      }
      else {
        iVar5 = 0;
        do {
          pLVar4 = StructType::GetChildType(type,iVar5);
          bVar2 = LogicalTypeIsValid(pLVar4);
          if (!bVar2) {
            return bVar2;
          }
          bVar6 = iVar3 - 1 != iVar5;
          iVar5 = iVar5 + 1;
        } while (bVar6);
      }
      return bVar2;
    case LIST:
    case MAP:
      type = ListType::GetChildType(type);
      break;
    default:
      goto switchD_0024091e_caseD_67;
    case UNION:
      iVar3 = UnionType::GetMemberCount(type);
      if (iVar3 != 0) {
        iVar5 = 0;
        do {
          pLVar4 = UnionType::GetMemberType(type,iVar5);
          bVar2 = LogicalTypeIsValid(pLVar4);
          if (!bVar2) {
            return bVar2;
          }
          bVar6 = iVar3 - 1 != iVar5;
          iVar5 = iVar5 + 1;
        } while (bVar6);
        return bVar2;
      }
      goto switchD_0024091e_caseD_67;
    case ARRAY:
      type = ArrayType::GetChildType(type);
    }
  } while( true );
}

Assistant:

bool LogicalTypeIsValid(const LogicalType &type) {
	switch (type.id()) {
	case LogicalTypeId::STRUCT:
	case LogicalTypeId::UNION:
	case LogicalTypeId::LIST:
	case LogicalTypeId::MAP:
	case LogicalTypeId::ARRAY:
	case LogicalTypeId::DECIMAL:
		// these types are only valid with auxiliary info
		if (!type.AuxInfo()) {
			return false;
		}
		break;
	default:
		break;
	}
	switch (type.id()) {
	case LogicalTypeId::ANY:
	case LogicalTypeId::INVALID:
	case LogicalTypeId::UNKNOWN:
		return false;
	case LogicalTypeId::STRUCT: {
		auto child_count = StructType::GetChildCount(type);
		for (idx_t i = 0; i < child_count; i++) {
			if (!LogicalTypeIsValid(StructType::GetChildType(type, i))) {
				return false;
			}
		}
		return true;
	}
	case LogicalTypeId::UNION: {
		auto member_count = UnionType::GetMemberCount(type);
		for (idx_t i = 0; i < member_count; i++) {
			if (!LogicalTypeIsValid(UnionType::GetMemberType(type, i))) {
				return false;
			}
		}
		return true;
	}
	case LogicalTypeId::LIST:
	case LogicalTypeId::MAP:
		return LogicalTypeIsValid(ListType::GetChildType(type));
	case LogicalTypeId::ARRAY:
		return LogicalTypeIsValid(ArrayType::GetChildType(type));
	default:
		return true;
	}
}